

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::SparseTextureCommitmentTestCase::sparseAllocateTexture
          (SparseTextureCommitmentTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint levels)

{
  int iVar1;
  GLenum GVar2;
  ostream *poVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->field_0x88,"Sparse Allocate [levels: ",0x19);
  poVar3 = (ostream *)std::ostream::operator<<(&this->field_0x88,levels);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] - ",4);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])
            (this,gl,(ulong)(uint)target,(ulong)(uint)format,texture);
  (*gl->texParameteri)(target,0x91a6,1);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"texParameteri error occurred for GL_TEXTURE_SPARSE_ARB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                  ,0x755);
  if (target == 0x84f5) {
    (this->mState).levels = 1;
  }
  else {
    (*gl->getTexParameteriv)(target,0x91aa,&(this->mState).levels);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"glGetTexParameteriv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                    ,0x75b);
    iVar1 = (this->mState).levels;
    if (iVar1 < levels) {
      levels = iVar1;
    }
    (this->mState).levels = levels;
  }
  gl4cts::Texture::Storage
            (gl,target,(this->mState).levels,format,(this->mState).width,(this->mState).height,
             (this->mState).depth);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"TexStorage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                  ,0x763);
  return true;
}

Assistant:

bool SparseTextureCommitmentTestCase::sparseAllocateTexture(const Functions& gl, GLint target, GLint format,
															GLuint& texture, GLint levels)
{
	mLog << "Sparse Allocate [levels: " << levels << "] - ";

	prepareTexture(gl, target, format, texture);

	gl.texParameteri(target, GL_TEXTURE_SPARSE_ARB, GL_TRUE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "texParameteri error occurred for GL_TEXTURE_SPARSE_ARB");

	// GL_TEXTURE_RECTANGLE can have only one level
	if (target != GL_TEXTURE_RECTANGLE)
	{
		gl.getTexParameteriv(target, GL_NUM_SPARSE_LEVELS_ARB, &mState.levels);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexParameteriv");

		mState.levels = deMin32(mState.levels, levels);
	}
	else
		mState.levels = 1;

	Texture::Storage(gl, target, mState.levels, format, mState.width, mState.height, mState.depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage");

	return true;
}